

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

U32 ZSTD_insertBt1(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,U32 mls,int extDict)

{
  uint uVar1;
  U32 UVar2;
  U32 *pUVar3;
  size_t sVar4;
  U32 local_104;
  BYTE *local_100;
  uint local_f4;
  BYTE *local_f0;
  size_t matchLength;
  U32 *nextPtr;
  BYTE *pBStack_d8;
  U32 nbCompares;
  size_t bestLength;
  U32 matchEndIdx;
  U32 windowLow;
  U32 dummy32;
  U32 *largerPtr;
  U32 *smallerPtr;
  U32 btLow;
  U32 current;
  BYTE *match;
  BYTE *prefixStart;
  BYTE *dictEnd;
  long lStack_88;
  U32 dictLimit;
  BYTE *dictBase;
  BYTE *base;
  size_t commonLengthLarger;
  size_t commonLengthSmaller;
  uint local_60;
  U32 matchIndex;
  U32 btMask;
  U32 btLog;
  U32 *bt;
  size_t h;
  U32 *pUStack_40;
  U32 hashLog;
  U32 *hashTable;
  ZSTD_compressionParameters *cParams;
  int extDict_local;
  U32 mls_local;
  BYTE *iend_local;
  BYTE *ip_local;
  ZSTD_matchState_t *ms_local;
  
  hashTable = &(ms->cParams).windowLog;
  pUStack_40 = ms->hashTable;
  h._4_4_ = (ms->cParams).hashLog;
  cParams._0_4_ = extDict;
  cParams._4_4_ = mls;
  _extDict_local = iend;
  iend_local = ip;
  ip_local = (BYTE *)ms;
  bt = (U32 *)ZSTD_hashPtr(ip,h._4_4_,mls);
  _btMask = *(long *)(ip_local + 0x40);
  matchIndex = hashTable[1] - 1;
  local_60 = (1 << ((byte)matchIndex & 0x1f)) - 1;
  commonLengthSmaller._4_4_ = pUStack_40[(long)bt];
  commonLengthLarger = 0;
  base = (BYTE *)0x0;
  dictBase = *(BYTE **)(ip_local + 8);
  lStack_88 = *(long *)(ip_local + 0x10);
  dictEnd._4_4_ = *(uint *)(ip_local + 0x18);
  prefixStart = (BYTE *)(lStack_88 + (ulong)dictEnd._4_4_);
  match = dictBase + dictEnd._4_4_;
  smallerPtr._4_4_ = (int)iend_local - (int)dictBase;
  if (local_60 < smallerPtr._4_4_) {
    local_f4 = smallerPtr._4_4_ - local_60;
  }
  else {
    local_f4 = 0;
  }
  smallerPtr._0_4_ = local_f4;
  largerPtr = (U32 *)(_btMask + (ulong)((smallerPtr._4_4_ & local_60) << 1) * 4);
  uVar1 = *(uint *)(ip_local + 0x1c);
  bestLength._4_4_ = smallerPtr._4_4_ + 9;
  pBStack_d8 = (BYTE *)0x8;
  UVar2 = hashTable[3];
  pUStack_40[(long)bt] = smallerPtr._4_4_;
  nextPtr._4_4_ = 1 << ((byte)UVar2 & 0x1f);
  _windowLow = largerPtr + 1;
LAB_007213ba:
  do {
    if (nextPtr._4_4_ == 0 || commonLengthSmaller._4_4_ < uVar1) {
LAB_00721642:
      *_windowLow = 0;
      *largerPtr = 0;
      if (pBStack_d8 < (BYTE *)0x181) {
        ms_local._4_4_ = bestLength._4_4_ - (smallerPtr._4_4_ + 8);
      }
      else {
        if ((int)pBStack_d8 - 0x180U < 0xc1) {
          local_104 = (int)pBStack_d8 - 0x180;
        }
        else {
          local_104 = 0xc0;
        }
        ms_local._4_4_ = local_104;
      }
      return ms_local._4_4_;
    }
    pUVar3 = (U32 *)(_btMask + (ulong)((commonLengthSmaller._4_4_ & local_60) << 1) * 4);
    if (commonLengthLarger < base) {
      local_100 = (BYTE *)commonLengthLarger;
    }
    else {
      local_100 = base;
    }
    if (((int)cParams == 0) ||
       ((BYTE *)(ulong)dictEnd._4_4_ <= local_100 + commonLengthSmaller._4_4_)) {
      _btLow = dictBase + commonLengthSmaller._4_4_;
      sVar4 = ZSTD_count(iend_local + (long)local_100,_btLow + (long)local_100,_extDict_local);
      local_f0 = local_100 + sVar4;
    }
    else {
      _btLow = (BYTE *)(lStack_88 + (ulong)commonLengthSmaller._4_4_);
      sVar4 = ZSTD_count_2segments
                        (iend_local + (long)local_100,_btLow + (long)local_100,_extDict_local,
                         prefixStart,match);
      local_f0 = local_100 + sVar4;
      if ((BYTE *)(ulong)dictEnd._4_4_ <= local_f0 + commonLengthSmaller._4_4_) {
        _btLow = dictBase + commonLengthSmaller._4_4_;
      }
    }
    if ((pBStack_d8 < local_f0) &&
       (pBStack_d8 = local_f0,
       (BYTE *)(ulong)(bestLength._4_4_ - commonLengthSmaller._4_4_) < local_f0)) {
      bestLength._4_4_ = commonLengthSmaller._4_4_ + (int)local_f0;
    }
    if (iend_local + (long)local_f0 == _extDict_local) goto LAB_00721642;
    if (iend_local[(long)local_f0] <= _btLow[(long)local_f0]) {
      *_windowLow = commonLengthSmaller._4_4_;
      base = local_f0;
      if (commonLengthSmaller._4_4_ <= (uint)smallerPtr) {
        _windowLow = &matchEndIdx;
        goto LAB_00721642;
      }
      commonLengthSmaller._4_4_ = *pUVar3;
      nextPtr._4_4_ = nextPtr._4_4_ + -1;
      _windowLow = pUVar3;
      goto LAB_007213ba;
    }
    *largerPtr = commonLengthSmaller._4_4_;
    commonLengthLarger = (size_t)local_f0;
    if (commonLengthSmaller._4_4_ <= (uint)smallerPtr) {
      largerPtr = &matchEndIdx;
      goto LAB_00721642;
    }
    largerPtr = pUVar3 + 1;
    commonLengthSmaller._4_4_ = pUVar3[1];
    nextPtr._4_4_ = nextPtr._4_4_ + -1;
  } while( true );
}

Assistant:

static U32 ZSTD_insertBt1(
                ZSTD_matchState_t* ms,
                const BYTE* const ip, const BYTE* const iend,
                U32 const mls, const int extDict)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32 matchIndex = hashTable[h];
    size_t commonLengthSmaller=0, commonLengthLarger=0;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const U32 dictLimit = ms->window.dictLimit;
    const BYTE* const dictEnd = dictBase + dictLimit;
    const BYTE* const prefixStart = base + dictLimit;
    const BYTE* match;
    const U32 current = (U32)(ip-base);
    const U32 btLow = btMask >= current ? 0 : current - btMask;
    U32* smallerPtr = bt + 2*(current&btMask);
    U32* largerPtr  = smallerPtr + 1;
    U32 dummy32;   /* to be nullified at the end */
    U32 const windowLow = ms->window.lowLimit;
    U32 matchEndIdx = current+8+1;
    size_t bestLength = 8;
    U32 nbCompares = 1U << cParams->searchLog;
#ifdef ZSTD_C_PREDICT
    U32 predictedSmall = *(bt + 2*((current-1)&btMask) + 0);
    U32 predictedLarge = *(bt + 2*((current-1)&btMask) + 1);
    predictedSmall += (predictedSmall>0);
    predictedLarge += (predictedLarge>0);
#endif /* ZSTD_C_PREDICT */

    DEBUGLOG(8, "ZSTD_insertBt1 (%u)", current);

    assert(ip <= iend-8);   /* required for h calculation */
    hashTable[h] = current;   /* Update Hash Table */

    assert(windowLow > 0);
    while (nbCompares-- && (matchIndex >= windowLow)) {
        U32* const nextPtr = bt + 2*(matchIndex & btMask);
        size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
        assert(matchIndex < current);

#ifdef ZSTD_C_PREDICT   /* note : can create issues when hlog small <= 11 */
        const U32* predictPtr = bt + 2*((matchIndex-1) & btMask);   /* written this way, as bt is a roll buffer */
        if (matchIndex == predictedSmall) {
            /* no need to check length, result known */
            *smallerPtr = matchIndex;
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
            matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            predictedSmall = predictPtr[1] + (predictPtr[1]>0);
            continue;
        }
        if (matchIndex == predictedLarge) {
            *largerPtr = matchIndex;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
            predictedLarge = predictPtr[0] + (predictPtr[0]>0);
            continue;
        }
#endif

        if (!extDict || (matchIndex+matchLength >= dictLimit)) {
            assert(matchIndex+matchLength >= dictLimit);   /* might be wrong if actually extDict */
            match = base + matchIndex;
            matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
        } else {
            match = dictBase + matchIndex;
            matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
            if (matchIndex+matchLength >= dictLimit)
                match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
        }

        if (matchLength > bestLength) {
            bestLength = matchLength;
            if (matchLength > matchEndIdx - matchIndex)
                matchEndIdx = matchIndex + (U32)matchLength;
        }

        if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
            break;   /* drop , to guarantee consistency ; miss a bit of compression, but other solutions can corrupt tree */
        }

        if (match[matchLength] < ip[matchLength]) {  /* necessarily within buffer */
            /* match is smaller than current */
            *smallerPtr = matchIndex;             /* update smaller idx */
            commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            smallerPtr = nextPtr+1;               /* new "candidate" => larger than match, which was smaller than target */
            matchIndex = nextPtr[1];              /* new matchIndex, larger than previous and closer to current */
        } else {
            /* match is larger than current */
            *largerPtr = matchIndex;
            commonLengthLarger = matchLength;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
    }   }

    *smallerPtr = *largerPtr = 0;
    if (bestLength > 384) return MIN(192, (U32)(bestLength - 384));   /* speed optimization */
    assert(matchEndIdx > current + 8);
    return matchEndIdx - (current + 8);
}